

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

uint32_t LogLuv32fromXYZ(float *XYZ,int em)

{
  int iVar1;
  double dVar2;
  double s;
  double v;
  double u;
  uint ve;
  uint ue;
  uint Le;
  int em_local;
  float *XYZ_local;
  
  iVar1 = LogL16fromY((double)XYZ[1],em);
  dVar2 = (double)XYZ[2] * 3.0 + (double)XYZ[1] * 15.0 + (double)*XYZ;
  if ((iVar1 == 0) || (dVar2 <= 0.0)) {
    v = 0.210526316;
    s = 0.473684211;
  }
  else {
    v = ((double)*XYZ * 4.0) / dVar2;
    s = ((double)XYZ[1] * 9.0) / dVar2;
  }
  if (0.0 < v) {
    u._4_4_ = tiff_itrunc(v * 410.0,em);
  }
  else {
    u._4_4_ = 0;
  }
  if (0xff < u._4_4_) {
    u._4_4_ = 0xff;
  }
  if (0.0 < s) {
    u._0_4_ = tiff_itrunc(s * 410.0,em);
  }
  else {
    u._0_4_ = 0;
  }
  if (0xff < u._0_4_) {
    u._0_4_ = 0xff;
  }
  return iVar1 << 0x10 | u._4_4_ << 8 | u._0_4_;
}

Assistant:

uint32_t
    LogLuv32fromXYZ(float *XYZ, int em)
{
    unsigned int Le, ue, ve;
    double u, v, s;
    /* encode luminance */
    Le = (unsigned int)LogL16fromY(XYZ[1], em);
    /* encode color */
    s = XYZ[0] + 15. * XYZ[1] + 3. * XYZ[2];
    if (!Le || s <= 0.)
    {
        u = U_NEU;
        v = V_NEU;
    }
    else
    {
        u = 4. * XYZ[0] / s;
        v = 9. * XYZ[1] / s;
    }
    if (u <= 0.)
        ue = 0;
    else
        ue = tiff_itrunc(UVSCALE * u, em);
    if (ue > 255)
        ue = 255;
    if (v <= 0.)
        ve = 0;
    else
        ve = tiff_itrunc(UVSCALE * v, em);
    if (ve > 255)
        ve = 255;
    /* combine encodings */
    return (Le << 16 | ue << 8 | ve);
}